

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O1

void __thiscall deci_FlexLexer::yyunput(deci_FlexLexer *this,int c,char *yy_bp)

{
  int *piVar1;
  yy_buffer_state *pyVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar7 = this->yy_c_buf_p;
  *pcVar7 = this->yy_hold_char;
  pcVar6 = this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_ch_buf;
  if (pcVar7 < pcVar6 + 2) {
    pcVar5 = pcVar6 + (long)this->yy_buffer_stack[this->yy_buffer_stack_top]->yy_buf_size + 2;
    pcVar6 = pcVar6 + (long)this->yy_n_chars + 2;
    while( true ) {
      pyVar2 = this->yy_buffer_stack[this->yy_buffer_stack_top];
      pcVar3 = pyVar2->yy_ch_buf;
      if (pcVar6 <= pcVar3) break;
      pcVar3 = pcVar6 + -1;
      pcVar6 = pcVar6 + -1;
      pcVar5[-1] = *pcVar3;
      pcVar5 = pcVar5 + -1;
    }
    iVar4 = (int)pcVar5 - (int)pcVar6;
    pcVar7 = pcVar7 + iVar4;
    yy_bp = yy_bp + iVar4;
    iVar4 = pyVar2->yy_buf_size;
    this->yy_n_chars = iVar4;
    pyVar2->yy_n_chars = iVar4;
    if (pcVar7 < pcVar3 + 2) {
      (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])(this,"flex scanner push-back overflow");
    }
  }
  pcVar7[-1] = (char)c;
  if (c == 10) {
    piVar1 = &(this->super_FlexLexer).yylineno;
    *piVar1 = *piVar1 + -1;
  }
  (this->super_FlexLexer).yytext = yy_bp;
  this->yy_hold_char = pcVar7[-1];
  this->yy_c_buf_p = pcVar7 + -1;
  return;
}

Assistant:

void yyFlexLexer::yyunput( int c, char* yy_bp)
{
	char *yy_cp;
    
    yy_cp = (yy_c_buf_p);

	/* undo effects of setting up yytext */
	*yy_cp = (yy_hold_char);

	if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
		{ /* need to shift things up to make room */
		/* +2 for EOB chars. */
		int number_to_move = (yy_n_chars) + 2;
		char *dest = &YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[
					YY_CURRENT_BUFFER_LVALUE->yy_buf_size + 2];
		char *source =
				&YY_CURRENT_BUFFER_LVALUE->yy_ch_buf[number_to_move];

		while ( source > YY_CURRENT_BUFFER_LVALUE->yy_ch_buf )
			*--dest = *--source;

		yy_cp += (int) (dest - source);
		yy_bp += (int) (dest - source);
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars =
			(yy_n_chars) = (int) YY_CURRENT_BUFFER_LVALUE->yy_buf_size;

		if ( yy_cp < YY_CURRENT_BUFFER_LVALUE->yy_ch_buf + 2 )
			YY_FATAL_ERROR( "flex scanner push-back overflow" );
		}

	*--yy_cp = (char) c;

    if ( c == '\n' ){
        --yylineno;
    }

	(yytext_ptr) = yy_bp;
	(yy_hold_char) = *yy_cp;
	(yy_c_buf_p) = yy_cp;
}